

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O3

bool __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::insert(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,Unit *key,
        unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_> *val)

{
  uint uVar1;
  InferenceExtra *pIVar2;
  InferenceExtra *pIVar3;
  bool bVar4;
  Entry *pEVar5;
  uint uVar6;
  uint uVar7;
  Unit *local_20;
  
  local_20 = key;
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  pEVar5 = findEntryToInsert(this,&local_20);
  uVar7 = (uint)(pEVar5->field_0)._infoData >> 2;
  uVar1 = this->_timestamp;
  bVar4 = ((pEVar5->field_0)._infoData & 1U) != 0;
  if (bVar4 || uVar7 != uVar1) {
    if (uVar7 == uVar1) {
      this->_deleted = this->_deleted + -1;
      uVar6 = (pEVar5->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar6 = uVar1 << 2;
    }
    (pEVar5->field_0)._infoData = uVar6;
    pEVar5->_key = local_20;
    pIVar2 = (val->_M_t).
             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
             _M_t.
             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
    (val->_M_t).
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)0x0;
    pIVar3 = (pEVar5->_val)._M_t.
             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
             _M_t.
             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
    (pEVar5->_val)._M_t.
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = pIVar2;
    if (pIVar3 != (InferenceExtra *)0x0) {
      (*pIVar3->_vptr_InferenceExtra[1])();
    }
    this->_size = this->_size + 1;
  }
  return bVar4 || uVar7 != uVar1;
}

Assistant:

bool insert(Key key, Val val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key = std::move(key);
      e->_val = std::move(val);
      _size++;
    }
    return !exists;

  }